

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_mechanism.c
# Opt level: O0

SASL_MECHANISM_HANDLE
saslmechanism_create
          (SASL_MECHANISM_INTERFACE_DESCRIPTION *sasl_mechanism_interface_description,
          void *sasl_mechanism_create_parameters)

{
  LOGGER_LOG p_Var1;
  undefined8 uVar2;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  SASL_MECHANISM_HANDLE result;
  void *sasl_mechanism_create_parameters_local;
  SASL_MECHANISM_INTERFACE_DESCRIPTION *sasl_mechanism_interface_description_local;
  
  if (sasl_mechanism_interface_description == (SASL_MECHANISM_INTERFACE_DESCRIPTION *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/sasl_mechanism.c"
                ,"saslmechanism_create",0x17,1,"NULL sasl_mechanism_interface_description");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if ((((sasl_mechanism_interface_description->concrete_sasl_mechanism_create ==
              (SASL_MECHANISM_CREATE)0x0) ||
            (sasl_mechanism_interface_description->concrete_sasl_mechanism_destroy ==
             (SASL_MECHANISM_DESTROY)0x0)) ||
           (sasl_mechanism_interface_description->concrete_sasl_mechanism_get_init_bytes ==
            (SASL_MECHANISM_GET_INIT_BYTES)0x0)) ||
          (sasl_mechanism_interface_description->concrete_sasl_mechanism_get_mechanism_name ==
           (SASL_MECHANISM_GET_MECHANISM_NAME)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/sasl_mechanism.c"
                ,"saslmechanism_create",0x24,1,
                "Bad interface, concrete_sasl_mechanism_create = %p, concrete_sasl_mechanism_destroy = %p, concrete_sasl_mechanism_get_init_bytes = %p, concrete_sasl_mechanism_get_mechanism_name = %p"
                ,sasl_mechanism_interface_description->concrete_sasl_mechanism_create,
                sasl_mechanism_interface_description->concrete_sasl_mechanism_destroy,
                sasl_mechanism_interface_description->concrete_sasl_mechanism_get_init_bytes,
                sasl_mechanism_interface_description->concrete_sasl_mechanism_get_mechanism_name);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)malloc(0x10);
    if (l == (LOGGER_LOG)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/sasl_mechanism.c"
                  ,"saslmechanism_create",0x2d,1,"Could not allocate memory for SASL mechanism");
      }
    }
    else {
      *(SASL_MECHANISM_INTERFACE_DESCRIPTION **)l = sasl_mechanism_interface_description;
      uVar2 = (*(code *)**(undefined8 **)l)();
      *(undefined8 *)(l + 8) = uVar2;
      if (*(long *)(l + 8) == 0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/sasl_mechanism.c"
                    ,"saslmechanism_create",0x38,1,"concrete_sasl_mechanism_create failed");
        }
        free(l);
        l = (LOGGER_LOG)0x0;
      }
    }
  }
  return (SASL_MECHANISM_HANDLE)l;
}

Assistant:

SASL_MECHANISM_HANDLE saslmechanism_create(const SASL_MECHANISM_INTERFACE_DESCRIPTION* sasl_mechanism_interface_description, void* sasl_mechanism_create_parameters)
{
    SASL_MECHANISM_HANDLE result;

    /* Codes_SRS_SASL_MECHANISM_01_004: [If the argument `sasl_mechanism_interface_description` is NULL, `saslmechanism_create` shall return NULL.] */
    if (sasl_mechanism_interface_description == NULL)
    {
        LogError("NULL sasl_mechanism_interface_description");
        result = NULL;
    }
    /* Codes_SRS_SASL_MECHANISM_01_005: [If any `sasl_mechanism_interface_description` member is NULL, `saslmechanism_create` shall fail and return NULL.] */
    else if ((sasl_mechanism_interface_description->concrete_sasl_mechanism_create == NULL) ||
        (sasl_mechanism_interface_description->concrete_sasl_mechanism_destroy == NULL) ||
        (sasl_mechanism_interface_description->concrete_sasl_mechanism_get_init_bytes == NULL) ||
        (sasl_mechanism_interface_description->concrete_sasl_mechanism_get_mechanism_name == NULL))
    {
        LogError("Bad interface, concrete_sasl_mechanism_create = %p, concrete_sasl_mechanism_destroy = %p, concrete_sasl_mechanism_get_init_bytes = %p, concrete_sasl_mechanism_get_mechanism_name = %p",
            sasl_mechanism_interface_description->concrete_sasl_mechanism_create,
            sasl_mechanism_interface_description->concrete_sasl_mechanism_destroy,
            sasl_mechanism_interface_description->concrete_sasl_mechanism_get_init_bytes,
            sasl_mechanism_interface_description->concrete_sasl_mechanism_get_mechanism_name);
        result = NULL;
    }
    else
    {
        result = (SASL_MECHANISM_HANDLE)malloc(sizeof(SASL_MECHANISM_INSTANCE));
        if (result == NULL)
        {
            /* Codes_SRS_SASL_MECHANISM_01_006: [If allocating the memory needed for the SASL mechanism interface fails then `saslmechanism_create` shall fail and return NULL.] */
            LogError("Could not allocate memory for SASL mechanism");
        }
        else
        {
            result->sasl_mechanism_interface_description = sasl_mechanism_interface_description;

            /* Codes_SRS_SASL_MECHANISM_01_002: [In order to instantiate the concrete SASL mechanism implementation the function `concrete_sasl_mechanism_create` from the `sasl_mechanism_interface_description` shall be called, passing the `sasl_mechanism_create_parameters` to it.] */
            result->concrete_sasl_mechanism_handle = result->sasl_mechanism_interface_description->concrete_sasl_mechanism_create((void*)sasl_mechanism_create_parameters);
            if (result->concrete_sasl_mechanism_handle == NULL)
            {
                /* Codes_SRS_SASL_MECHANISM_01_003: [If the underlying `concrete_sasl_mechanism_create` call fails, `saslmechanism_create` shall return NULL.] */
                LogError("concrete_sasl_mechanism_create failed");
                free(result);
                result = NULL;
            }
        }
    }

    /* Codes_SRS_SASL_MECHANISM_01_001: [`saslmechanism_create` shall return on success a non-NULL handle to a new SASL mechanism interface.] */
    return result;
}